

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_expr.cpp
# Opt level: O0

any * Omega_h::anon_unknown_41::mul<2>(any *__return_storage_ptr__,LO size,any *lhs,any *rhs)

{
  Read<double> *pRVar1;
  bool bVar2;
  type_info *ptVar3;
  ParserFail *pPVar4;
  any *operand;
  any *operand_00;
  any *operand_01;
  any *operand_02;
  any *operand_03;
  double dVar5;
  Vector<2> VVar6;
  allocator local_c49;
  string local_c48 [38];
  undefined1 local_c22;
  allocator local_c21;
  string local_c20 [32];
  Read<double> local_c00;
  Read<double> local_bf0;
  Read<double> local_be0;
  Read<double> local_bd0;
  Read<double> local_bc0;
  Read<double> local_bb0;
  Read<double> local_ba0;
  Read<double> local_b90;
  Read<double> local_b80;
  allocator local_b69;
  string local_b68 [32];
  Read<double> local_b48;
  Read<double> local_b38;
  Write<double> local_b28;
  Read<double> local_b18;
  allocator local_b01;
  string local_b00 [48];
  Read<double> local_ad0;
  Read<double> local_ac0;
  Write<double> local_ab0;
  Read<double> local_aa0;
  Read<double> *local_a90;
  Read<double> *rhs_vals;
  Read<double> *lhs_vals;
  double local_a78;
  double local_a70;
  double local_a68;
  Matrix<2,_2> local_a60;
  undefined1 local_a40 [8];
  Matrix<2,_2> c_10;
  double local_a18;
  Matrix<2,_2> local_a10;
  Vector<2> local_9f0;
  Few<double,_2> local_9e0;
  Few<double,_2> local_9d0;
  double local_9c0;
  Matrix<2,_2> local_9b8;
  undefined1 local_998 [8];
  Matrix<2,_2> c_4;
  undefined1 local_958 [8];
  Matrix<2,_2> c_2;
  Vector<2> local_928;
  Few<double,_2> local_918;
  Vector<2> local_908;
  double local_8f8;
  any *local_8f0;
  any *rhs_local;
  any *lhs_local;
  any *paStack_8d8;
  LO size_local;
  Read<double> *local_8d0;
  Read<double> *local_8c8;
  Read<double> *local_8c0;
  Read<double> *local_8b8;
  Read<double> *local_8b0;
  Read<double> *local_8a8;
  Read<double> *local_8a0;
  Read<double> *local_898;
  undefined4 local_890;
  undefined4 local_88c;
  undefined4 local_888;
  undefined4 local_884;
  undefined4 local_880;
  undefined4 local_87c;
  Read<double> *local_878;
  Read<double> *local_870;
  ulong local_868;
  Read<double> *local_860;
  Read<double> *local_858;
  ulong local_850;
  Read<double> *local_848;
  Read<double> *local_840;
  ulong local_838;
  Read<double> *local_830;
  Read<double> *local_828;
  ulong local_820;
  Read<double> *local_818;
  Read<double> *local_810;
  ulong local_808;
  Read<double> *local_800;
  Read<double> *local_7f8;
  ulong local_7f0;
  Read<double> *local_7e8;
  Read<double> *local_7e0;
  ulong local_7d8;
  Read<double> *local_7d0;
  Read<double> *local_7c8;
  ulong local_7c0;
  int local_7b4;
  double dStack_7b0;
  Int i;
  double local_7a8 [3];
  Vector<2> c;
  int local_72c;
  Int i_1;
  double local_720 [3];
  Vector<2> c_1;
  double local_6e0 [4];
  double local_6c0;
  double local_6b8;
  int local_69c;
  double dStack_698;
  Int j;
  int local_68c;
  undefined1 *local_688;
  int local_67c;
  double *local_678;
  int local_66c;
  double dStack_668;
  Int i_2;
  double local_660 [3];
  Vector<2> c_3;
  double local_5d8 [4];
  double local_5b8;
  double local_5b0;
  int local_594;
  double dStack_590;
  Int j_1;
  int local_584;
  undefined1 *local_580;
  int local_574;
  double *local_570;
  int local_564;
  double dStack_560;
  Int i_3;
  double local_558 [3];
  Vector<2> c_5;
  double local_4d8 [4];
  double local_4b8;
  double local_4b0;
  double local_498;
  double local_490;
  int local_474;
  Int j_2;
  double local_460 [3];
  Vector<2> c_6;
  int local_3fc;
  Int i_7;
  double local_3e8 [3];
  Vector<2> c_9;
  int local_394;
  Int i_6;
  double local_388 [3];
  Vector<2> c_8;
  int local_344;
  Int i_5;
  double local_338 [3];
  Vector<2> c_7;
  Read<double> *local_2d8;
  double local_2d0 [3];
  Read<double> *local_2b8;
  double local_2b0;
  double local_288;
  double local_280;
  int local_278;
  int local_274;
  Int j_3;
  int local_264;
  Read<double> **local_260;
  double local_258 [4];
  double local_238;
  double local_230;
  double local_218;
  double local_210;
  int local_1f4;
  Int j_4;
  Read<double> *local_1e0;
  double local_1d8;
  double local_1d0;
  Vector<2> c_11;
  int local_17c;
  Int i_10;
  double local_168 [3];
  Vector<2> c_14;
  int local_114;
  Int i_9;
  double local_108 [3];
  Vector<2> c_13;
  int local_c4;
  Int i_8;
  double local_b8 [3];
  Vector<2> c_12;
  int local_74;
  double dStack_70;
  Int i_4;
  double out;
  double local_60;
  double local_58 [2];
  int local_44;
  double *local_40;
  int local_34;
  double *local_30;
  undefined4 local_24;
  double *local_20;
  undefined4 local_14;
  double *local_10;
  
  local_8f0 = rhs;
  rhs_local = lhs;
  lhs_local._4_4_ = size;
  paStack_8d8 = __return_storage_ptr__;
  ptVar3 = any::type(lhs);
  bVar2 = std::type_info::operator==(ptVar3,(type_info *)&double::typeinfo);
  if (bVar2) {
    ptVar3 = any::type(local_8f0);
    bVar2 = std::type_info::operator==(ptVar3,(type_info *)&double::typeinfo);
    if (bVar2) {
      dVar5 = any_cast<double>(rhs_local);
      local_8f8 = any_cast<double>(local_8f0);
      local_8f8 = dVar5 * local_8f8;
      any::any<double,void>(__return_storage_ptr__,&local_8f8);
      return __return_storage_ptr__;
    }
  }
  ptVar3 = any::type(rhs_local);
  bVar2 = std::type_info::operator==(ptVar3,(type_info *)&Vector<2>::typeinfo);
  if (bVar2) {
    ptVar3 = any::type(local_8f0);
    bVar2 = std::type_info::operator==(ptVar3,(type_info *)&double::typeinfo);
    if (bVar2) {
      local_918.array_ = (double  [2])any_cast<Omega_h::Vector<2>>(rhs_local);
      dStack_7b0 = any_cast<double>(local_8f0);
      local_7a8[0] = local_918.array_[0];
      local_7a8[1] = local_918.array_[1];
      for (local_7b4 = 0; local_7b4 < 2; local_7b4 = local_7b4 + 1) {
        c.super_Few<double,_2>.array_[1]._4_4_ = local_7b4;
        (&c)[-1].super_Few<double,_2>.array_[(long)local_7b4 + 1] =
             local_7a8[local_7b4] * dStack_7b0;
      }
      local_908.super_Few<double,_2>.array_[0] = local_7a8[2];
      local_908.super_Few<double,_2>.array_[1] = c.super_Few<double,_2>.array_[0];
      any::any<Omega_h::Vector<2>,void>(__return_storage_ptr__,&local_908);
      return __return_storage_ptr__;
    }
  }
  ptVar3 = any::type(rhs_local);
  bVar2 = std::type_info::operator==(ptVar3,(type_info *)&double::typeinfo);
  if (bVar2) {
    ptVar3 = any::type(local_8f0);
    bVar2 = std::type_info::operator==(ptVar3,(type_info *)&Vector<2>::typeinfo);
    if (bVar2) {
      dVar5 = any_cast<double>(rhs_local);
      VVar6 = any_cast<Omega_h::Vector<2>>(local_8f0);
      local_720[1] = VVar6.super_Few<double,_2>.array_[1];
      c_2.super_Few<Omega_h::Vector<2>,_2>.array_[1].super_Few<double,_2>.array_[1] =
           VVar6.super_Few<double,_2>.array_[0];
      for (local_72c = 0; local_72c < 2; local_72c = local_72c + 1) {
        c_1.super_Few<double,_2>.array_[1]._4_4_ = local_72c;
        (&c_1)[-1].super_Few<double,_2>.array_[(long)local_72c + 1] = local_720[local_72c] * dVar5;
      }
      local_928.super_Few<double,_2>.array_[0] = local_720[2];
      local_928.super_Few<double,_2>.array_[1] = c_1.super_Few<double,_2>.array_[0];
      local_720[0] = c_2.super_Few<Omega_h::Vector<2>,_2>.array_[1].super_Few<double,_2>.array_[1];
      any::any<Omega_h::Vector<2>,void>(__return_storage_ptr__,&local_928);
      return __return_storage_ptr__;
    }
  }
  ptVar3 = any::type(rhs_local);
  bVar2 = std::type_info::operator==(ptVar3,(type_info *)&Matrix<2,2>::typeinfo);
  if (bVar2) {
    ptVar3 = any::type(local_8f0);
    bVar2 = std::type_info::operator==(ptVar3,(type_info *)&double::typeinfo);
    if (bVar2) {
      any_cast<Omega_h::Matrix<2,2>>
                ((Matrix<2,_2> *)
                 (c_4.super_Few<Omega_h::Vector<2>,_2>.array_[1].super_Few<double,_2>.array_ + 1),
                 (Omega_h *)rhs_local,operand);
      dStack_698 = any_cast<double>(local_8f0);
      local_6e0[0] = c_4.super_Few<Omega_h::Vector<2>,_2>.array_[1].super_Few<double,_2>.array_[1];
      for (local_69c = 0; local_69c < 2; local_69c = local_69c + 1) {
        local_67c = local_69c;
        local_678 = local_6e0;
        local_6c0 = local_678[(long)local_69c * 2];
        local_6b8 = local_6e0[(long)local_69c * 2 + 1];
        for (local_66c = 0; local_66c < 2; local_66c = local_66c + 1) {
          c_3.super_Few<double,_2>.array_[1]._4_4_ = local_66c;
          (&c_3)[-1].super_Few<double,_2>.array_[(long)local_66c + 1] =
               local_660[local_66c] * dStack_698;
        }
        local_68c = local_69c;
        local_688 = local_958;
        *(double *)(local_688 + (long)local_69c * 0x10) = local_660[2];
        c_2.super_Few<Omega_h::Vector<2>,_2>.array_[local_69c].super_Few<double,_2>.array_[0] =
             c_3.super_Few<double,_2>.array_[0];
        dStack_668 = dStack_698;
        local_660[0] = local_6c0;
        local_660[1] = local_6b8;
      }
      any::any<Omega_h::Matrix<2,2>,void>(__return_storage_ptr__,(Matrix<2,_2> *)local_958);
      return __return_storage_ptr__;
    }
  }
  ptVar3 = any::type(rhs_local);
  bVar2 = std::type_info::operator==(ptVar3,(type_info *)&double::typeinfo);
  if (bVar2) {
    ptVar3 = any::type(local_8f0);
    bVar2 = std::type_info::operator==(ptVar3,(type_info *)&Matrix<2,2>::typeinfo);
    if (bVar2) {
      dVar5 = any_cast<double>(rhs_local);
      any_cast<Omega_h::Matrix<2,2>>(&local_9b8,(Omega_h *)local_8f0,operand_00);
      local_5d8[0] = local_9b8.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.
                     array_[0];
      local_5d8[1] = local_9b8.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.
                     array_[1];
      local_5d8[2] = local_9b8.super_Few<Omega_h::Vector<2>,_2>.array_[1].super_Few<double,_2>.
                     array_[0];
      local_5d8[3] = local_9b8.super_Few<Omega_h::Vector<2>,_2>.array_[1].super_Few<double,_2>.
                     array_[1];
      for (local_594 = 0; local_594 < 2; local_594 = local_594 + 1) {
        local_574 = local_594;
        local_570 = local_5d8;
        local_5b8 = local_570[(long)local_594 * 2];
        local_5b0 = local_5d8[(long)local_594 * 2 + 1];
        for (local_564 = 0; local_564 < 2; local_564 = local_564 + 1) {
          c_5.super_Few<double,_2>.array_[1]._4_4_ = local_564;
          (&c_5)[-1].super_Few<double,_2>.array_[(long)local_564 + 1] = local_558[local_564] * dVar5
          ;
        }
        local_584 = local_594;
        local_580 = local_998;
        *(double *)(local_580 + (long)local_594 * 0x10) = local_558[2];
        c_4.super_Few<Omega_h::Vector<2>,_2>.array_[local_594].super_Few<double,_2>.array_[0] =
             c_5.super_Few<double,_2>.array_[0];
        dStack_560 = dVar5;
        local_558[0] = local_5b8;
        local_558[1] = local_5b0;
      }
      dStack_590 = dVar5;
      any::any<Omega_h::Matrix<2,2>,void>(__return_storage_ptr__,(Matrix<2,_2> *)local_998);
      return __return_storage_ptr__;
    }
  }
  ptVar3 = any::type(rhs_local);
  bVar2 = std::type_info::operator==(ptVar3,(type_info *)&Vector<2>::typeinfo);
  if (bVar2) {
    ptVar3 = any::type(local_8f0);
    bVar2 = std::type_info::operator==(ptVar3,(type_info *)&Vector<2>::typeinfo);
    if (bVar2) {
      local_9d0.array_ = (double  [2])any_cast<Omega_h::Vector<2>>(rhs_local);
      local_9e0.array_ = (double  [2])any_cast<Omega_h::Vector<2>>(local_8f0);
      local_58[0] = local_9d0.array_[0];
      local_58[1] = local_9d0.array_[1];
      out = local_9e0.array_[0];
      local_60 = local_9e0.array_[1];
      local_10 = local_58;
      local_14 = 0;
      local_20 = &out;
      local_24 = 0;
      dStack_70 = local_9d0.array_[0] * local_9e0.array_[0];
      for (local_74 = 1; local_74 < 2; local_74 = local_74 + 1) {
        local_34 = local_74;
        local_30 = local_58;
        local_44 = local_74;
        local_40 = &out;
        dStack_70 = local_30[local_74] * local_40[local_74] + dStack_70;
      }
      local_9c0 = dStack_70;
      any::any<double,void>(__return_storage_ptr__,&local_9c0);
      return __return_storage_ptr__;
    }
  }
  ptVar3 = any::type(rhs_local);
  bVar2 = std::type_info::operator==(ptVar3,(type_info *)&Matrix<2,2>::typeinfo);
  if (bVar2) {
    ptVar3 = any::type(local_8f0);
    bVar2 = std::type_info::operator==(ptVar3,(type_info *)&Vector<2>::typeinfo);
    if (bVar2) {
      any_cast<Omega_h::Matrix<2,2>>(&local_a10,(Omega_h *)rhs_local,operand_01);
      join_0x00001240_0x00001200_ = (double  [2])any_cast<Omega_h::Vector<2>>(local_8f0);
      local_4d8[0] = local_a10.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.
                     array_[0];
      local_4d8[1] = local_a10.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.
                     array_[1];
      local_4d8[2] = local_a10.super_Few<Omega_h::Vector<2>,_2>.array_[1].super_Few<double,_2>.
                     array_[0];
      local_4d8[3] = local_a10.super_Few<Omega_h::Vector<2>,_2>.array_[1].super_Few<double,_2>.
                     array_[1];
      local_460[0] = c_10.super_Few<Omega_h::Vector<2>,_2>.array_[1].super_Few<double,_2>.array_[1];
      local_460[1] = local_a18;
      for (local_344 = 0; local_344 < 2; local_344 = local_344 + 1) {
        c_7.super_Few<double,_2>.array_[1]._4_4_ = local_344;
        (&c_7)[-1].super_Few<double,_2>.array_[(long)local_344 + 1] =
             local_338[local_344] *
             c_10.super_Few<Omega_h::Vector<2>,_2>.array_[1].super_Few<double,_2>.array_[1];
      }
      local_460[2] = local_338[2];
      c_6.super_Few<double,_2>.array_[0] = c_7.super_Few<double,_2>.array_[0];
      for (local_474 = 1; local_474 < 2; local_474 = local_474 + 1) {
        local_498 = local_460[2];
        local_490 = c_6.super_Few<double,_2>.array_[0];
        c_6.super_Few<double,_2>.array_[1]._4_4_ = local_474;
        local_4b8 = local_4d8[(long)local_474 * 2];
        local_4b0 = local_4d8[(long)local_474 * 2 + 1];
        dVar5 = local_460[local_474];
        for (local_394 = 0; local_394 < 2; local_394 = local_394 + 1) {
          c_8.super_Few<double,_2>.array_[1]._4_4_ = local_394;
          (&c_8)[-1].super_Few<double,_2>.array_[(long)local_394 + 1] = local_388[local_394] * dVar5
          ;
        }
        local_3e8[0] = local_460[2];
        local_3e8[1] = c_6.super_Few<double,_2>.array_[0];
        for (local_3fc = 0; local_3fc < 2; local_3fc = local_3fc + 1) {
          c_9.super_Few<double,_2>.array_[1]._4_4_ = local_3fc;
          (&c_9)[-1].super_Few<double,_2>.array_[(long)local_3fc + 1] =
               local_3e8[local_3fc] + *(double *)(&stack0xfffffffffffffc08 + (long)local_3fc * 8);
        }
        local_460[2] = local_3e8[2];
        c_6.super_Few<double,_2>.array_[0] = c_9.super_Few<double,_2>.array_[0];
        local_388[0] = local_4b8;
        local_388[1] = local_4b0;
      }
      local_9f0.super_Few<double,_2>.array_[0] = local_460[2];
      local_9f0.super_Few<double,_2>.array_[1] = c_6.super_Few<double,_2>.array_[0];
      any::any<Omega_h::Vector<2>,void>(__return_storage_ptr__,&local_9f0);
      return __return_storage_ptr__;
    }
  }
  ptVar3 = any::type(rhs_local);
  bVar2 = std::type_info::operator==(ptVar3,(type_info *)&Matrix<2,2>::typeinfo);
  if (bVar2) {
    ptVar3 = any::type(local_8f0);
    bVar2 = std::type_info::operator==(ptVar3,(type_info *)&Matrix<2,2>::typeinfo);
    if (bVar2) {
      any_cast<Omega_h::Matrix<2,2>>(&local_a60,(Omega_h *)rhs_local,operand_02);
      any_cast<Omega_h::Matrix<2,2>>((Matrix<2,_2> *)&lhs_vals,(Omega_h *)local_8f0,operand_03);
      local_2d8 = lhs_vals;
      local_2d0[0] = local_a78;
      local_2d0[1] = local_a70;
      local_2d0[2] = local_a68;
      for (local_278 = 0; local_278 < 2; local_278 = local_278 + 1) {
        local_264 = local_278;
        local_260 = &local_2d8;
        local_2b8 = local_260[(long)local_278 * 2];
        local_2b0 = local_2d0[(long)local_278 * 2];
        for (local_c4 = 0; local_c4 < 2; local_c4 = local_c4 + 1) {
          c_12.super_Few<double,_2>.array_[1]._4_4_ = local_c4;
          (&c_12)[-1].super_Few<double,_2>.array_[(long)local_c4 + 1] =
               local_b8[local_c4] * (double)local_2b8;
        }
        local_1d0 = local_b8[2];
        c_11.super_Few<double,_2>.array_[0] = c_12.super_Few<double,_2>.array_[0];
        for (local_1f4 = 1; local_1f4 < 2; local_1f4 = local_1f4 + 1) {
          local_218 = local_1d0;
          local_210 = c_11.super_Few<double,_2>.array_[0];
          c_11.super_Few<double,_2>.array_[1]._4_4_ = local_1f4;
          local_238 = local_258[(long)local_1f4 * 2];
          local_230 = local_258[(long)local_1f4 * 2 + 1];
          pRVar1 = (&local_1e0)[local_1f4];
          for (local_114 = 0; local_114 < 2; local_114 = local_114 + 1) {
            c_13.super_Few<double,_2>.array_[1]._4_4_ = local_114;
            (&c_13)[-1].super_Few<double,_2>.array_[(long)local_114 + 1] =
                 local_108[local_114] * (double)pRVar1;
          }
          local_168[0] = local_1d0;
          local_168[1] = c_11.super_Few<double,_2>.array_[0];
          for (local_17c = 0; local_17c < 2; local_17c = local_17c + 1) {
            c_14.super_Few<double,_2>.array_[1]._4_4_ = local_17c;
            (&c_14)[-1].super_Few<double,_2>.array_[(long)local_17c + 1] =
                 local_168[local_17c] + *(double *)(&stack0xfffffffffffffe88 + (long)local_17c * 8);
          }
          local_1d0 = local_168[2];
          c_11.super_Few<double,_2>.array_[0] = c_14.super_Few<double,_2>.array_[0];
          local_108[0] = local_238;
          local_108[1] = local_230;
        }
        local_288 = local_1d0;
        local_280 = c_11.super_Few<double,_2>.array_[0];
        local_274 = local_278;
        _j_3 = local_a40;
        *(double *)(_j_3 + (long)local_278 * 0x10) = local_1d0;
        c_10.super_Few<Omega_h::Vector<2>,_2>.array_[local_278].super_Few<double,_2>.array_[0] =
             c_11.super_Few<double,_2>.array_[0];
        local_1e0 = local_2b8;
        local_1d8 = local_2b0;
      }
      any::any<Omega_h::Matrix<2,2>,void>(__return_storage_ptr__,(Matrix<2,_2> *)local_a40);
      return __return_storage_ptr__;
    }
  }
  ptVar3 = any::type(rhs_local);
  bVar2 = std::type_info::operator==(ptVar3,(type_info *)&Read<double>::typeinfo);
  if (bVar2) {
    ptVar3 = any::type(local_8f0);
    bVar2 = std::type_info::operator==(ptVar3,(type_info *)&Read<double>::typeinfo);
    if (bVar2) {
      rhs_vals = any_cast<Omega_h::Read<double>&>(rhs_local);
      local_a90 = any_cast<Omega_h::Read<double>&>(local_8f0);
      if (((ulong)(local_a90->write_).shared_alloc_.alloc & 1) == 0) {
        local_868 = ((local_a90->write_).shared_alloc_.alloc)->size;
      }
      else {
        local_868 = (ulong)(local_a90->write_).shared_alloc_.alloc >> 3;
      }
      local_898 = local_a90;
      local_878 = local_a90;
      local_870 = local_a90;
      if ((int)(local_868 >> 3) == lhs_local._4_4_) {
        Read<double>::Read(&local_ac0,rhs_vals);
        Read<double>::Read(&local_ad0,local_a90);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_b00,"",&local_b01);
        multiply_each<double>((Omega_h *)&local_ab0,&local_ac0,&local_ad0,(string *)local_b00);
        Read<double>::Read(&local_aa0,&local_ab0);
        any::any<Omega_h::Read<double>,void>(__return_storage_ptr__,&local_aa0);
        Read<double>::~Read(&local_aa0);
        Write<double>::~Write(&local_ab0);
        std::__cxx11::string::~string(local_b00);
        std::allocator<char>::~allocator((allocator<char> *)&local_b01);
        Read<double>::~Read(&local_ad0);
        Read<double>::~Read(&local_ac0);
      }
      else {
        local_8a0 = rhs_vals;
        local_860 = rhs_vals;
        local_858 = rhs_vals;
        if (((ulong)(rhs_vals->write_).shared_alloc_.alloc & 1) == 0) {
          local_850 = ((rhs_vals->write_).shared_alloc_.alloc)->size;
        }
        else {
          local_850 = (ulong)(rhs_vals->write_).shared_alloc_.alloc >> 3;
        }
        if ((int)(local_850 >> 3) != lhs_local._4_4_) {
          local_8a8 = rhs_vals;
          local_848 = rhs_vals;
          local_840 = rhs_vals;
          if (((ulong)(rhs_vals->write_).shared_alloc_.alloc & 1) == 0) {
            local_838 = ((rhs_vals->write_).shared_alloc_.alloc)->size;
          }
          else {
            local_838 = (ulong)(rhs_vals->write_).shared_alloc_.alloc >> 3;
          }
          if ((int)(local_838 >> 3) == lhs_local._4_4_ * 2) {
            if (((ulong)(local_a90->write_).shared_alloc_.alloc & 1) == 0) {
              local_820 = ((local_a90->write_).shared_alloc_.alloc)->size;
            }
            else {
              local_820 = (ulong)(local_a90->write_).shared_alloc_.alloc >> 3;
            }
            local_8b0 = local_a90;
            local_830 = local_a90;
            local_828 = local_a90;
            if ((int)(local_820 >> 3) == lhs_local._4_4_ * 2) {
              Read<double>::Read(&local_b90,rhs_vals);
              Read<double>::Read(&local_ba0,local_a90);
              dot_vectors((Omega_h *)&local_b80,&local_b90,&local_ba0,2);
              any::any<Omega_h::Read<double>,void>(__return_storage_ptr__,&local_b80);
              Read<double>::~Read(&local_b80);
              Read<double>::~Read(&local_ba0);
              Read<double>::~Read(&local_b90);
              return __return_storage_ptr__;
            }
          }
          local_8b8 = rhs_vals;
          local_818 = rhs_vals;
          local_810 = rhs_vals;
          if (((ulong)(rhs_vals->write_).shared_alloc_.alloc & 1) == 0) {
            local_808 = ((rhs_vals->write_).shared_alloc_.alloc)->size;
          }
          else {
            local_808 = (ulong)(rhs_vals->write_).shared_alloc_.alloc >> 3;
          }
          local_87c = 2;
          local_880 = 2;
          if ((int)(local_808 >> 3) == lhs_local._4_4_ * 4) {
            if (((ulong)(local_a90->write_).shared_alloc_.alloc & 1) == 0) {
              local_7f0 = ((local_a90->write_).shared_alloc_.alloc)->size;
            }
            else {
              local_7f0 = (ulong)(local_a90->write_).shared_alloc_.alloc >> 3;
            }
            local_8c0 = local_a90;
            local_800 = local_a90;
            local_7f8 = local_a90;
            if ((int)(local_7f0 >> 3) == lhs_local._4_4_ * 2) {
              Read<double>::Read(&local_bc0,rhs_vals);
              Read<double>::Read(&local_bd0,local_a90);
              matrices_times_vectors((Omega_h *)&local_bb0,&local_bc0,&local_bd0,2);
              any::any<Omega_h::Read<double>,void>(__return_storage_ptr__,&local_bb0);
              Read<double>::~Read(&local_bb0);
              Read<double>::~Read(&local_bd0);
              Read<double>::~Read(&local_bc0);
              return __return_storage_ptr__;
            }
          }
          local_8c8 = rhs_vals;
          local_7e8 = rhs_vals;
          local_7e0 = rhs_vals;
          if (((ulong)(rhs_vals->write_).shared_alloc_.alloc & 1) == 0) {
            local_7d8 = ((rhs_vals->write_).shared_alloc_.alloc)->size;
          }
          else {
            local_7d8 = (ulong)(rhs_vals->write_).shared_alloc_.alloc >> 3;
          }
          local_884 = 2;
          local_888 = 2;
          if ((int)(local_7d8 >> 3) == lhs_local._4_4_ * 4) {
            if (((ulong)(local_a90->write_).shared_alloc_.alloc & 1) == 0) {
              local_7c0 = ((local_a90->write_).shared_alloc_.alloc)->size;
            }
            else {
              local_7c0 = (ulong)(local_a90->write_).shared_alloc_.alloc >> 3;
            }
            local_88c = 2;
            local_890 = 2;
            local_8d0 = local_a90;
            local_7d0 = local_a90;
            local_7c8 = local_a90;
            if ((int)(local_7c0 >> 3) == lhs_local._4_4_ * 4) {
              Read<double>::Read(&local_bf0,rhs_vals);
              Read<double>::Read(&local_c00,local_a90);
              matrices_times_matrices((Omega_h *)&local_be0,&local_bf0,&local_c00,2);
              any::any<Omega_h::Read<double>,void>(__return_storage_ptr__,&local_be0);
              Read<double>::~Read(&local_be0);
              Read<double>::~Read(&local_c00);
              Read<double>::~Read(&local_bf0);
              return __return_storage_ptr__;
            }
          }
          local_c22 = 1;
          pPVar4 = (ParserFail *)__cxa_allocate_exception(0x10);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_c20,"Unexpected array size in * operator",&local_c21);
          ParserFail::ParserFail(pPVar4,(string *)local_c20);
          local_c22 = 0;
          __cxa_throw(pPVar4,&ParserFail::typeinfo,ParserFail::~ParserFail);
        }
        Read<double>::Read(&local_b38,local_a90);
        Read<double>::Read(&local_b48,rhs_vals);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_b68,"",&local_b69);
        multiply_each<double>((Omega_h *)&local_b28,&local_b38,&local_b48,(string *)local_b68);
        Read<double>::Read(&local_b18,&local_b28);
        any::any<Omega_h::Read<double>,void>(__return_storage_ptr__,&local_b18);
        Read<double>::~Read(&local_b18);
        Write<double>::~Write(&local_b28);
        std::__cxx11::string::~string(local_b68);
        std::allocator<char>::~allocator((allocator<char> *)&local_b69);
        Read<double>::~Read(&local_b48);
        Read<double>::~Read(&local_b38);
      }
      return __return_storage_ptr__;
    }
  }
  pPVar4 = (ParserFail *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c48,"Invalid operand types to * operator",&local_c49);
  ParserFail::ParserFail(pPVar4,(string *)local_c48);
  __cxa_throw(pPVar4,&ParserFail::typeinfo,ParserFail::~ParserFail);
}

Assistant:

any mul(LO size, any& lhs, any& rhs) {
  if (lhs.type() == typeid(Real) && rhs.type() == typeid(Real)) {
    return any_cast<Real>(lhs) * any_cast<Real>(rhs);
    /* begin multiply non-scalar by scalar (commutative) */
  } else if (lhs.type() == typeid(Vector<dim>) && rhs.type() == typeid(Real)) {
    return any_cast<Vector<dim>>(lhs) * any_cast<Real>(rhs);
  } else if (lhs.type() == typeid(Real) && rhs.type() == typeid(Vector<dim>)) {
    return any_cast<Real>(lhs) * any_cast<Vector<dim>>(rhs);
  } else if (lhs.type() == typeid(Tensor<dim>) && rhs.type() == typeid(Real)) {
    return any_cast<Tensor<dim>>(lhs) * any_cast<Real>(rhs);
  } else if (lhs.type() == typeid(Real) && rhs.type() == typeid(Tensor<dim>)) {
    return any_cast<Real>(lhs) * any_cast<Tensor<dim>>(rhs);
    /* dot product */
  } else if (lhs.type() == typeid(Vector<dim>) &&
             rhs.type() == typeid(Vector<dim>)) {
    return any_cast<Vector<dim>>(lhs) * any_cast<Vector<dim>>(rhs);
    /* matrix * vector (non-commutative) */
  } else if (lhs.type() == typeid(Tensor<dim>) &&
             rhs.type() == typeid(Vector<dim>)) {
    return any_cast<Tensor<dim>>(lhs) * any_cast<Vector<dim>>(rhs);
    /* matrix * matrix (non-commutative) */
  } else if (lhs.type() == typeid(Tensor<dim>) &&
             rhs.type() == typeid(Tensor<dim>)) {
    return any_cast<Tensor<dim>>(lhs) * any_cast<Tensor<dim>>(rhs);
  } else if (lhs.type() == typeid(Reals) && rhs.type() == typeid(Reals)) {
    auto& lhs_vals = any_cast<Reals&>(lhs);
    auto& rhs_vals = any_cast<Reals&>(rhs);
    if (rhs_vals.size() == size) {  // RHS is scalars
      return Reals(multiply_each(lhs_vals, rhs_vals));
    } else if (lhs_vals.size() == size) {  // LHS is scalars
      return Reals(multiply_each(rhs_vals, lhs_vals));
    } else if (lhs_vals.size() == size * dim &&
               rhs_vals.size() == size * dim) {  // dot products
      return dot_vectors(lhs_vals, rhs_vals, dim);
    } else if (lhs_vals.size() == size * matrix_ncomps(dim, dim) &&
               rhs_vals.size() == size * dim) {  // matrices * vectors
      return matrices_times_vectors(lhs_vals, rhs_vals, dim);
    } else if (lhs_vals.size() == size * matrix_ncomps(dim, dim) &&
               rhs_vals.size() == size * matrix_ncomps(dim, dim)) {
      return matrices_times_matrices(lhs_vals, rhs_vals, dim);
    } else {
      throw ParserFail("Unexpected array size in * operator");
    }
  } else {
    throw ParserFail("Invalid operand types to * operator");
  }
}